

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

RepeatedField<unsigned_int> * __thiscall
google::protobuf::RepeatedField<unsigned_int>::operator=
          (RepeatedField<unsigned_int> *this,RepeatedField<unsigned_int> *other)

{
  RepeatedField<unsigned_int> *this_00;
  RepeatedField<unsigned_int> *other_00;
  RepeatedField<unsigned_int> *in_RSI;
  RepeatedField<unsigned_int> *in_RDI;
  RepeatedField<unsigned_int> *in_stack_00000098;
  RepeatedField<unsigned_int> *in_stack_000000a0;
  RepeatedField<unsigned_int> *in_stack_ffffffffffffffe0;
  
  if (in_RDI != in_RSI) {
    this_00 = (RepeatedField<unsigned_int> *)GetArena(in_stack_ffffffffffffffe0);
    other_00 = (RepeatedField<unsigned_int> *)GetArena(this_00);
    if (this_00 == other_00) {
      InternalSwap(in_stack_000000a0,in_stack_00000098);
    }
    else {
      CopyFrom(this_00,other_00);
    }
  }
  return in_RDI;
}

Assistant:

inline RepeatedField<Element>& RepeatedField<Element>::operator=(
    RepeatedField&& other) noexcept {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // the two fields are on different arenas.
  if (this != &other) {
    if (this->GetArena() != other.GetArena()) {
      CopyFrom(other);
    } else {
      InternalSwap(&other);
    }
  }
  return *this;
}